

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_cgraph *
ggml_graph_view(ggml_cgraph *__return_storage_ptr__,ggml_cgraph *cgraph0,int i0,int i1)

{
  __return_storage_ptr__->size = 0;
  __return_storage_ptr__->n_nodes = 0;
  *(undefined8 *)&__return_storage_ptr__->n_leafs = 0;
  (__return_storage_ptr__->visited_hash_set).keys = (ggml_tensor **)0x0;
  *(undefined8 *)&__return_storage_ptr__->order = 0;
  (__return_storage_ptr__->visited_hash_set).size = 0;
  (__return_storage_ptr__->visited_hash_set).used = (ggml_bitset_t *)0x0;
  __return_storage_ptr__->grad_accs = (ggml_tensor **)0x0;
  __return_storage_ptr__->leafs = (ggml_tensor **)0x0;
  __return_storage_ptr__->nodes = (ggml_tensor **)0x0;
  __return_storage_ptr__->grads = (ggml_tensor **)0x0;
  __return_storage_ptr__->n_nodes = i1 - i0;
  __return_storage_ptr__->nodes = cgraph0->nodes + i0;
  __return_storage_ptr__->order = cgraph0->order;
  return __return_storage_ptr__;
}

Assistant:

struct ggml_cgraph ggml_graph_view(struct ggml_cgraph * cgraph0, int i0, int i1) {
    struct ggml_cgraph cgraph = {
        /*.size             =*/ 0,
        /*.n_nodes          =*/ i1 - i0,
        /*.n_leafs          =*/ 0,
        /*.nodes            =*/ cgraph0->nodes + i0,
        /*.grads            =*/ NULL, // gradients would need visited_hash_set
        /*.grad_accs        =*/ NULL,
        /*.leafs            =*/ NULL,
        /*.visited_hash_set =*/ { 0, NULL, NULL },
        /*.order            =*/ cgraph0->order,
    };

    return cgraph;
}